

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *raw_arguments)

{
  initializer_list<char> __l;
  string_view used_name;
  string_view used_name_00;
  undefined8 uVar1;
  iterator iVar2;
  bool bVar3;
  reference __str;
  iterator __x;
  reference __rhs;
  mapped_type_conflict *pmVar4;
  pointer ppVar5;
  pointer this_00;
  ArgumentParser *this_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  size_type sVar7;
  const_reference pvVar8;
  pointer ppVar9;
  pointer pAVar10;
  runtime_error *prVar11;
  __sv_type name;
  __sv_type prefix_chars;
  string_view input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  size_t local_388;
  char *pcStack_380;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  _List_iterator<argparse::Argument> local_358;
  _List_iterator<argparse::Argument> argument_2;
  __sv_type local_348;
  _Self local_338;
  iterator arg_map_it2;
  string local_318 [8];
  string hypothetical_arg;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *compound_arg;
  _List_iterator<argparse::Argument> local_2b0;
  _List_iterator<argparse::Argument> argument_1;
  __sv_type local_2a0;
  _Self local_290;
  iterator arg_map_it;
  _List_iterator<argparse::Argument> local_260;
  _Self argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_209;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  reference local_1c8;
  Argument *opt;
  iterator __end7;
  iterator __begin7;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range7;
  __sv_type local_1a0;
  string_view local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined4 local_e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unprocessed_arguments;
  _Self local_a8;
  iterator subparser_it;
  string_view maybe_command;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *current_argument;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  iterator positional_argument_it;
  iterator end;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *raw_arguments_local;
  ArgumentParser *this_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)raw_arguments;
  preprocess_arguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,this,raw_arguments);
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->m_program_name);
  if ((bVar3) &&
     (bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_30), !bVar3)) {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_program_name,__str);
  }
  positional_argument_it._M_node =
       (_List_node_base *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_30);
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                 (&this->m_positional_arguments);
  __x = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30);
  local_58 = std::
             next<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (__x._M_current,1);
LAB_00145d4a:
  do {
    bVar3 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&local_58,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&positional_argument_it);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      this->m_is_parsed = true;
      local_e0 = 0;
LAB_00146ba8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
      return;
    }
    __rhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_58);
    name = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__rhs);
    prefix_chars = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&this->m_prefix_chars);
    local_80 = prefix_chars._M_str;
    bVar3 = Argument::is_positional(name,prefix_chars);
    if (bVar3) {
      maybe_command._M_str =
           (char *)std::
                   end<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                             (&this->m_positional_arguments);
      bVar3 = std::operator==((_Self *)&it,(_Self *)&maybe_command._M_str);
      if (bVar3) {
        _subparser_it = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__rhs);
        local_a8._M_node =
             (_Base_ptr)
             std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
             ::find(&this->m_subparser_map,(key_type *)&subparser_it);
        unprocessed_arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                      ::end(&this->m_subparser_map);
        bVar3 = std::operator==(&local_a8,
                                (_Self *)&unprocessed_arguments.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          bVar3 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                            (&this->m_positional_arguments);
          if (!bVar3) {
            argument._M_node._7_1_ = 1;
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_250,
                           "Maximum number of positional arguments exceeded, failed to parse \'",
                           __rhs);
            std::operator+(&local_230,&local_250,"\'");
            std::runtime_error::runtime_error(prVar11,(string *)&local_230);
            argument._M_node._7_1_ = 0;
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar3 = std::
                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                  ::empty(&this->m_subparser_map);
          if (bVar3) {
            bVar3 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::
                    empty(&this->m_optional_arguments);
            if (bVar3) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"Zero positional arguments expected");
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            __end7 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::
                     begin(&this->m_optional_arguments);
            opt = (Argument *)
                  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                            (&this->m_optional_arguments);
            while( true ) {
              bVar3 = std::operator==(&__end7,(_Self *)&opt);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar11,"Zero positional arguments expected");
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_1c8 = std::_List_iterator<argparse::Argument>::operator*(&__end7);
              bVar3 = std::any::has_value(&local_1c8->m_implicit_value);
              if ((!bVar3) && (((byte)local_1c8->field_0x140 >> 4 & 1) == 0)) break;
              std::_List_iterator<argparse::Argument>::operator++(&__end7);
            }
            local_209 = 1;
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            Argument::get_usage_full_abi_cxx11_(&local_208,local_1c8);
            std::operator+(&local_1e8,"Zero positional arguments expected, did you mean ",&local_208
                          );
            std::runtime_error::runtime_error(prVar11,(string *)&local_1e8);
            local_209 = 0;
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          __range7._6_1_ = 1;
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_160,"Failed to parse \'",__rhs);
          std::operator+(&local_140,&local_160,"\', did you mean \'");
          local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__rhs);
          input._M_str = local_80;
          input._M_len = (size_t)local_1a0._M_str;
          local_190 = details::
                      get_most_similar_string<std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>>>
                                ((details *)&this->m_subparser_map,
                                 (map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                                  *)local_1a0._M_len,input);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_180,&local_190,(allocator<char> *)((long)&__range7 + 7));
          std::operator+(&local_120,&local_140,&local_180);
          std::operator+(&local_100,&local_120,"\'");
          std::runtime_error::runtime_error(prVar11,(string *)&local_100);
          __range7._6_1_ = 0;
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_d0._M_current = local_58._M_current;
        local_d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             positional_argument_it._M_node;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_d9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,
                   local_d0,local_d8,&local_d9);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_d9);
        this->m_is_parsed = true;
        pmVar4 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                 ::operator[](&this->m_subparser_used,(key_type *)&subparser_it);
        *pmVar4 = true;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>
                 ::operator->(&local_a8);
        this_00 = std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>::operator->
                            (&ppVar5->second);
        this_01 = std::reference_wrapper<argparse::ArgumentParser>::get(this_00);
        parse_args(this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c8);
        local_e0 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
        goto LAB_00146ba8;
      }
      local_260._M_node =
           (_List_node_base *)
           std::_List_iterator<argparse::Argument>::operator++
                     ((_List_iterator<argparse::Argument> *)&it,0);
      pAVar10 = std::_List_iterator<argparse::Argument>::operator->(&local_260);
      iVar2 = positional_argument_it;
      _Var6._M_current = local_58._M_current;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&arg_map_it);
      local_58 = Argument::
                 consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (pAVar10,_Var6,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )iVar2._M_node,_arg_map_it);
      goto LAB_00145d4a;
    }
    local_2a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__rhs);
    local_290._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
         ::find(&this->m_argument_map,&local_2a0);
    argument_1._M_node =
         (_List_node_base *)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
         ::end(&this->m_argument_map);
    bVar3 = std::operator==(&local_290,(_Self *)&argument_1);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (__rhs);
      if (1 < sVar7) {
        pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](__rhs,0);
        bVar3 = is_valid_prefix_char(this,*pvVar8);
        if (bVar3) {
          pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](__rhs,1);
          bVar3 = is_valid_prefix_char(this,*pvVar8);
          if (!bVar3) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_58);
            for (hypothetical_arg.field_2._8_8_ = 1; uVar1 = hypothetical_arg.field_2._8_8_,
                sVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (__rhs), (ulong)uVar1 < sVar7;
                hypothetical_arg.field_2._8_8_ = hypothetical_arg.field_2._8_8_ + 1) {
              arg_map_it2._M_node._6_1_ = 0x2d;
              pvVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (__rhs,hypothetical_arg.field_2._8_8_);
              arg_map_it2._M_node._7_1_ = *pvVar8;
              std::allocator<char>::allocator();
              __l._M_len = 2;
              __l._M_array = (iterator)((long)&arg_map_it2._M_node + 6);
              std::__cxx11::string::string
                        (local_318,__l,(allocator<char> *)((long)&arg_map_it2._M_node + 5));
              std::allocator<char>::~allocator((allocator<char> *)((long)&arg_map_it2._M_node + 5));
              local_348 = std::__cxx11::string::operator_cast_to_basic_string_view(local_318);
              local_338._M_node =
                   (_Base_ptr)
                   std::
                   map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                   ::find(&this->m_argument_map,&local_348);
              argument_2._M_node =
                   (_List_node_base *)
                   std::
                   map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                   ::end(&this->m_argument_map);
              bVar3 = std::operator==(&local_338,(_Self *)&argument_2);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                local_3a9 = 1;
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_3a8,"Unknown argument: ",__rhs);
                std::runtime_error::runtime_error(prVar11,(string *)&local_3a8);
                local_3a9 = 0;
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                       ::operator->(&local_338);
              local_358._M_node = (ppVar9->second)._M_node;
              pAVar10 = std::_List_iterator<argparse::Argument>::operator->(&local_358);
              local_368._M_current = local_58._M_current;
              local_370._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   positional_argument_it._M_node;
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                       ::operator->(&local_338);
              local_388 = (ppVar9->first)._M_len;
              pcStack_380 = (ppVar9->first)._M_str;
              used_name_00._M_len = (ppVar9->first)._M_len;
              used_name_00._M_str = (ppVar9->first)._M_str;
              local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Argument::
                          consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                    (pAVar10,local_368,local_370,used_name_00);
              local_58 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_360;
              std::__cxx11::string::~string(local_318);
            }
            goto LAB_00145d4a;
          }
        }
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_3d0,"Unknown argument: ",__rhs);
      std::runtime_error::runtime_error(prVar11,(string *)&local_3d0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
             ::operator->(&local_290);
    local_2b0._M_node = (ppVar9->second)._M_node;
    pAVar10 = std::_List_iterator<argparse::Argument>::operator->(&local_2b0);
    _Var6 = std::
            next<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (local_58,1);
    iVar2 = positional_argument_it;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
             ::operator->(&local_290);
    used_name._M_len = (ppVar9->first)._M_len;
    used_name._M_str = (ppVar9->first)._M_str;
    local_58 = Argument::
               consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (pAVar10,_Var6,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )iVar2._M_node,used_name);
  } while( true );
}

Assistant:

void parse_args_internal(const std::vector<std::string> &raw_arguments) {
    auto arguments = preprocess_arguments(raw_arguments);
    if (m_program_name.empty() && !arguments.empty()) {
      m_program_name = arguments.front();
    }
    auto end = std::end(arguments);
    auto positional_argument_it = std::begin(m_positional_arguments);
    for (auto it = std::next(std::begin(arguments)); it != end;) {
      const auto &current_argument = *it;
      if (Argument::is_positional(current_argument, m_prefix_chars)) {
        if (positional_argument_it == std::end(m_positional_arguments)) {

          std::string_view maybe_command = current_argument;

          // Check sub-parsers
          auto subparser_it = m_subparser_map.find(maybe_command);
          if (subparser_it != m_subparser_map.end()) {

            // build list of remaining args
            const auto unprocessed_arguments =
                std::vector<std::string>(it, end);

            // invoke subparser
            m_is_parsed = true;
            m_subparser_used[maybe_command] = true;
            return subparser_it->second->get().parse_args(
                unprocessed_arguments);
          }

          if (m_positional_arguments.empty()) {

            // Ask the user if they argument they provided was a typo
            // for some sub-parser,
            // e.g., user provided `git totes` instead of `git notes`
            if (!m_subparser_map.empty()) {
              throw std::runtime_error(
                  "Failed to parse '" + current_argument + "', did you mean '" +
                  std::string{details::get_most_similar_string(
                      m_subparser_map, current_argument)} +
                  "'");
            }

            // Ask the user if they meant to use a specific optional argument
            if (!m_optional_arguments.empty()) {
              for (const auto &opt : m_optional_arguments) {
                if (!opt.m_implicit_value.has_value()) {
                  // not a flag, requires a value
                  if (!opt.m_is_used) {
                    throw std::runtime_error(
                        "Zero positional arguments expected, did you mean " +
                        opt.get_usage_full());
                  }
                }
              }

              throw std::runtime_error("Zero positional arguments expected");
            } else {
              throw std::runtime_error("Zero positional arguments expected");
            }
          } else {
            throw std::runtime_error("Maximum number of positional arguments "
                                     "exceeded, failed to parse '" +
                                     current_argument + "'");
          }
        }
        auto argument = positional_argument_it++;
        it = argument->consume(it, end);
        continue;
      }

      auto arg_map_it = m_argument_map.find(current_argument);
      if (arg_map_it != m_argument_map.end()) {
        auto argument = arg_map_it->second;
        it = argument->consume(std::next(it), end, arg_map_it->first);
      } else if (const auto &compound_arg = current_argument;
                 compound_arg.size() > 1 &&
                 is_valid_prefix_char(compound_arg[0]) &&
                 !is_valid_prefix_char(compound_arg[1])) {
        ++it;
        for (std::size_t j = 1; j < compound_arg.size(); j++) {
          auto hypothetical_arg = std::string{'-', compound_arg[j]};
          auto arg_map_it2 = m_argument_map.find(hypothetical_arg);
          if (arg_map_it2 != m_argument_map.end()) {
            auto argument = arg_map_it2->second;
            it = argument->consume(it, end, arg_map_it2->first);
          } else {
            throw std::runtime_error("Unknown argument: " + current_argument);
          }
        }
      } else {
        throw std::runtime_error("Unknown argument: " + current_argument);
      }
    }
    m_is_parsed = true;
  }